

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int amqpvalue_get_source(AMQP_VALUE value,SOURCE_HANDLE *source_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  SOURCE_HANDLE pSVar3;
  AMQP_VALUE pAVar4;
  AMQP_VALUE pAVar5;
  uint32_t list_item_count;
  terminus_durability durable;
  AMQP_VALUE outcomes_array;
  uint local_3c;
  AMQP_VALUE local_38;
  AMQP_VALUE local_30;
  
  pSVar3 = (SOURCE_HANDLE)malloc(8);
  if (pSVar3 == (SOURCE_HANDLE)0x0) {
    *source_handle = (SOURCE_HANDLE)0x0;
    return 0x2f0f;
  }
  pSVar3->composite_value = (AMQP_VALUE)0x0;
  *source_handle = pSVar3;
  pAVar4 = amqpvalue_get_inplace_described_value(value);
  if (pAVar4 != (AMQP_VALUE)0x0) {
    iVar1 = amqpvalue_get_list_item_count(pAVar4,&local_3c);
    if (iVar1 != 0) {
      return 0x2f1e;
    }
    if (local_3c != 0) {
      pAVar5 = amqpvalue_get_list_item(pAVar4,0);
      if (pAVar5 != (AMQP_VALUE)0x0) {
        amqpvalue_destroy(pAVar5);
      }
      if (1 < local_3c) {
        pAVar5 = amqpvalue_get_list_item(pAVar4,1);
        if (pAVar5 != (AMQP_VALUE)0x0) {
          AVar2 = amqpvalue_get_type(pAVar5);
          if ((AVar2 != AMQP_TYPE_NULL) &&
             (iVar1 = amqpvalue_get_uint(pAVar5,(uint32_t *)&local_38), iVar1 != 0)) {
            amqpvalue_destroy(pAVar5);
            source_destroy(*source_handle);
            return 0x2f47;
          }
          amqpvalue_destroy(pAVar5);
        }
        if (2 < local_3c) {
          pAVar5 = amqpvalue_get_list_item(pAVar4,2);
          if (pAVar5 != (AMQP_VALUE)0x0) {
            AVar2 = amqpvalue_get_type(pAVar5);
            if ((AVar2 != AMQP_TYPE_NULL) &&
               (iVar1 = amqpvalue_get_symbol(pAVar5,(char **)&local_38), iVar1 != 0)) {
              amqpvalue_destroy(pAVar5);
              source_destroy(*source_handle);
              return 0x2f64;
            }
            amqpvalue_destroy(pAVar5);
          }
          if (3 < local_3c) {
            pAVar5 = amqpvalue_get_list_item(pAVar4,3);
            if (pAVar5 != (AMQP_VALUE)0x0) {
              AVar2 = amqpvalue_get_type(pAVar5);
              if ((AVar2 != AMQP_TYPE_NULL) &&
                 (iVar1 = amqpvalue_get_uint(pAVar5,(uint32_t *)&local_38), iVar1 != 0)) {
                amqpvalue_destroy(pAVar5);
                source_destroy(*source_handle);
                return 0x2f81;
              }
              amqpvalue_destroy(pAVar5);
            }
            if (4 < local_3c) {
              pAVar5 = amqpvalue_get_list_item(pAVar4,4);
              if (pAVar5 != (AMQP_VALUE)0x0) {
                AVar2 = amqpvalue_get_type(pAVar5);
                if ((AVar2 != AMQP_TYPE_NULL) &&
                   (iVar1 = amqpvalue_get_boolean(pAVar5,(_Bool *)&local_38), iVar1 != 0)) {
                  amqpvalue_destroy(pAVar5);
                  source_destroy(*source_handle);
                  return 0x2f9e;
                }
                amqpvalue_destroy(pAVar5);
              }
              if (5 < local_3c) {
                pAVar5 = amqpvalue_get_list_item(pAVar4,5);
                if (pAVar5 != (AMQP_VALUE)0x0) {
                  AVar2 = amqpvalue_get_type(pAVar5);
                  if ((AVar2 != AMQP_TYPE_NULL) &&
                     (iVar1 = amqpvalue_get_map(pAVar5,&local_38), iVar1 != 0)) {
                    amqpvalue_destroy(pAVar5);
                    source_destroy(*source_handle);
                    return 0x2fbb;
                  }
                  amqpvalue_destroy(pAVar5);
                }
                if (6 < local_3c) {
                  pAVar5 = amqpvalue_get_list_item(pAVar4,6);
                  if (pAVar5 != (AMQP_VALUE)0x0) {
                    AVar2 = amqpvalue_get_type(pAVar5);
                    if ((AVar2 != AMQP_TYPE_NULL) &&
                       (iVar1 = amqpvalue_get_symbol(pAVar5,(char **)&local_38), iVar1 != 0)) {
                      amqpvalue_destroy(pAVar5);
                      source_destroy(*source_handle);
                      return 0x2fd8;
                    }
                    amqpvalue_destroy(pAVar5);
                  }
                  if (7 < local_3c) {
                    pAVar5 = amqpvalue_get_list_item(pAVar4,7);
                    if (pAVar5 != (AMQP_VALUE)0x0) {
                      AVar2 = amqpvalue_get_type(pAVar5);
                      if ((AVar2 != AMQP_TYPE_NULL) &&
                         (iVar1 = amqpvalue_get_map(pAVar5,&local_38), iVar1 != 0)) {
                        amqpvalue_destroy(pAVar5);
                        source_destroy(*source_handle);
                        return 0x2ff5;
                      }
                      amqpvalue_destroy(pAVar5);
                    }
                    if (8 < local_3c) {
                      pAVar5 = amqpvalue_get_list_item(pAVar4,8);
                      if (pAVar5 != (AMQP_VALUE)0x0) {
                        amqpvalue_destroy(pAVar5);
                      }
                      if (9 < local_3c) {
                        pAVar5 = amqpvalue_get_list_item(pAVar4,9);
                        if (pAVar5 != (AMQP_VALUE)0x0) {
                          AVar2 = amqpvalue_get_type(pAVar5);
                          if (AVar2 != AMQP_TYPE_NULL) {
                            local_38 = (AMQP_VALUE)0x0;
                            AVar2 = amqpvalue_get_type(pAVar5);
                            if (((AVar2 != AMQP_TYPE_ARRAY) ||
                                (iVar1 = amqpvalue_get_array(pAVar5,&local_30), iVar1 != 0)) &&
                               (iVar1 = amqpvalue_get_symbol(pAVar5,(char **)&local_38), iVar1 != 0)
                               ) {
                              amqpvalue_destroy(pAVar5);
                              source_destroy(*source_handle);
                              return 0x3021;
                            }
                          }
                          amqpvalue_destroy(pAVar5);
                        }
                        if ((10 < local_3c) &&
                           (pAVar4 = amqpvalue_get_list_item(pAVar4,10), pAVar4 != (AMQP_VALUE)0x0))
                        {
                          AVar2 = amqpvalue_get_type(pAVar4);
                          if (AVar2 != AMQP_TYPE_NULL) {
                            local_38 = (AMQP_VALUE)0x0;
                            AVar2 = amqpvalue_get_type(pAVar4);
                            if (((AVar2 != AMQP_TYPE_ARRAY) ||
                                (iVar1 = amqpvalue_get_array(pAVar4,&local_30), iVar1 != 0)) &&
                               (iVar1 = amqpvalue_get_symbol(pAVar4,(char **)&local_38), iVar1 != 0)
                               ) {
                              amqpvalue_destroy(pAVar4);
                              source_destroy(*source_handle);
                              return 0x3040;
                            }
                          }
                          amqpvalue_destroy(pAVar4);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    pAVar4 = amqpvalue_clone(value);
    pSVar3->composite_value = pAVar4;
    return 0;
  }
  source_destroy(*source_handle);
  return 0x2f17;
}

Assistant:

int amqpvalue_get_source(AMQP_VALUE value, SOURCE_HANDLE* source_handle)
{
    int result;
    SOURCE_INSTANCE* source_instance = (SOURCE_INSTANCE*)source_create_internal();
    *source_handle = source_instance;
    if (*source_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            source_destroy(*source_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* address */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* durable */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                terminus_durability durable;
                                if (amqpvalue_get_terminus_durability(item_value, &durable) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    source_destroy(*source_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* expiry-policy */
                    if (list_item_count > 2)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 2);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                terminus_expiry_policy expiry_policy;
                                if (amqpvalue_get_terminus_expiry_policy(item_value, &expiry_policy) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    source_destroy(*source_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* timeout */
                    if (list_item_count > 3)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 3);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                seconds timeout;
                                if (amqpvalue_get_seconds(item_value, &timeout) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    source_destroy(*source_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* dynamic */
                    if (list_item_count > 4)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 4);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool dynamic;
                                if (amqpvalue_get_boolean(item_value, &dynamic) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    source_destroy(*source_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* dynamic-node-properties */
                    if (list_item_count > 5)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 5);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                node_properties dynamic_node_properties;
                                if (amqpvalue_get_node_properties(item_value, &dynamic_node_properties) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    source_destroy(*source_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* distribution-mode */
                    if (list_item_count > 6)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 6);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* distribution_mode;
                                if (amqpvalue_get_symbol(item_value, &distribution_mode) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    source_destroy(*source_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* filter */
                    if (list_item_count > 7)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 7);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                filter_set filter;
                                if (amqpvalue_get_filter_set(item_value, &filter) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    source_destroy(*source_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* default-outcome */
                    if (list_item_count > 8)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 8);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* outcomes */
                    if (list_item_count > 9)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 9);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* outcomes = NULL;
                                AMQP_VALUE outcomes_array;
                                if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, &outcomes_array) != 0)) &&
                                    (amqpvalue_get_symbol(item_value, &outcomes) != 0))
                                {
                                    amqpvalue_destroy(item_value);
                                    source_destroy(*source_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* capabilities */
                    if (list_item_count > 10)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 10);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* capabilities = NULL;
                                AMQP_VALUE capabilities_array;
                                if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, &capabilities_array) != 0)) &&
                                    (amqpvalue_get_symbol(item_value, &capabilities) != 0))
                                {
                                    amqpvalue_destroy(item_value);
                                    source_destroy(*source_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    source_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}